

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O2

void fill_room(level *lev,mkroom *croom,boolean prefilled)

{
  undefined1 *puVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int x;
  int y;
  
  if (croom == (mkroom *)0x0) {
    return;
  }
  bVar2 = croom->rtype;
  if (bVar2 == 0) {
    return;
  }
  if (prefilled == '\0') {
    uVar3 = (uint)bVar2;
    if ('\x11' < (char)bVar2) {
      stock_room(uVar3 - 0x12 & 0xff,lev,croom);
      uVar3 = 1;
      goto LAB_0023ab35;
    }
    if (uVar3 < 0x11) {
      if ((0x141e4U >> (uVar3 & 0x1f) & 1) == 0) {
        if (uVar3 == 4) {
          for (x = (int)croom->lx; x <= croom->hx; x = x + 1) {
            for (y = (int)croom->ly; y <= croom->hy; y = y + 1) {
              bVar2 = depth(&lev->z);
              iVar4 = rn2((uint)(byte)((bVar2 ^ (char)bVar2 >> 7) - ((char)bVar2 >> 7)) * 100);
              mkgold((ulong)(iVar4 + 0x33),lev,x,y);
            }
          }
        }
      }
      else {
        fill_zoo(lev,croom);
      }
    }
    bVar2 = croom->rtype;
  }
  bVar2 = bVar2 - 2;
  if (0xe < bVar2) {
    return;
  }
  if ((0x517fU >> (bVar2 & 0x1f) & 1) == 0) {
    return;
  }
  uVar3 = *(uint *)(&DAT_002bc050 + (ulong)bVar2 * 4);
LAB_0023ab35:
  puVar1 = &(lev->flags).field_0x8;
  *(uint *)puVar1 = *(uint *)puVar1 | uVar3;
  return;
}

Assistant:

void fill_room(struct level *lev, struct mkroom *croom, boolean prefilled)
{
	if (!croom || croom->rtype == OROOM)
	    return;

	if (!prefilled) {
	    int x, y;

	    /* Shop ? */
	    if (croom->rtype >= SHOPBASE) {
		stock_room(croom->rtype - SHOPBASE, lev, croom);
		lev->flags.has_shop = TRUE;
		return;
	    }

	    switch (croom->rtype) {
		case VAULT:
		    for (x = croom->lx; x <= croom->hx; x++)
			for (y = croom->ly; y<=croom->hy; y++)
			    mkgold((long)rn1(abs(depth(&lev->z)) * 100, 51),
				   lev, x, y);
		    break;
		case GARDEN:
		case COURT:
		case ZOO:
		case BEEHIVE:
		case LEMUREPIT:
		case MORGUE:
		case BARRACKS:
		    fill_zoo(lev, croom);
		    break;
	    }
	}
	switch (croom->rtype) {
	    case VAULT:
		lev->flags.has_vault = TRUE;
		break;
	    case ZOO:
		lev->flags.has_zoo = TRUE;
		break;
	    case GARDEN:
		lev->flags.has_garden = TRUE;
		break;
	    case COURT:
		lev->flags.has_court = TRUE;
		break;
	    case MORGUE:
		lev->flags.has_morgue = TRUE;
		break;
	    case BEEHIVE:
		lev->flags.has_beehive = TRUE;
		break;
	    case LEMUREPIT:
		lev->flags.has_lemurepit = TRUE;
		break;
	    case BARRACKS:
		lev->flags.has_barracks = TRUE;
		break;
	    case TEMPLE:
		lev->flags.has_temple = TRUE;
		break;
	    case SWAMP:
		lev->flags.has_swamp = TRUE;
		break;
	}
}